

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_crc.cc
# Opt level: O0

void absl::lts_20250127::cord_internal::CordRepCrc::Destroy(CordRepCrc *node)

{
  CordRepCrc *node_local;
  
  if (node->child != (CordRep *)0x0) {
    CordRep::Unref(node->child);
  }
  if (node != (CordRepCrc *)0x0) {
    ~CordRepCrc(node);
    operator_delete(node,0x20);
  }
  return;
}

Assistant:

void CordRepCrc::Destroy(CordRepCrc* node) {
  if (node->child != nullptr) {
    CordRep::Unref(node->child);
  }
  delete node;
}